

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void block(LexState *ls)

{
  FuncState *fs;
  Dyndata *pDVar1;
  BlockCnt bl;
  BlockCnt local_20;
  
  fs = ls->fs;
  local_20.insidetbc = false;
  local_20.isloop = '\0';
  local_20.nactvar = fs->nactvar;
  pDVar1 = fs->ls->dyd;
  local_20.firstlabel = (pDVar1->label).n;
  local_20.firstgoto = (pDVar1->gt).n;
  local_20.upval = '\0';
  local_20.previous = fs->bl;
  if (local_20.previous != (BlockCnt *)0x0) {
    local_20.insidetbc = (local_20.previous)->insidetbc != '\0';
  }
  fs->bl = &local_20;
  statlist(ls);
  leaveblock(fs);
  return;
}

Assistant:

static void block (LexState *ls) {
  /* block -> statlist */
  FuncState *fs = ls->fs;
  BlockCnt bl;
  enterblock(fs, &bl, 0);
  statlist(ls);
  leaveblock(fs);
}